

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus DecodeMemMMImm4(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint RegNo;
  uint32_t uVar1;
  uint uVar2;
  DecodeStatus DVar3;
  MCInst *in_RCX;
  uint in_ESI;
  MCInst *in_RDI;
  uint Base;
  uint Reg;
  uint Offset;
  undefined4 in_stack_ffffffffffffffc0;
  uint numBits;
  
  RegNo = in_ESI & 0xf;
  numBits = 3;
  fieldFromInstruction(in_ESI,7,3);
  uVar1 = fieldFromInstruction(in_ESI,4,numBits);
  uVar2 = MCInst_getOpcode(in_RDI);
  if (((uVar2 == 0x39b) || (uVar2 == 0x3ba)) || (uVar2 == 0x3d6)) {
    DVar3 = DecodeGPRMM16RegisterClass
                      (in_RCX,RegNo,CONCAT44(uVar1,uVar2),
                       (MCRegisterInfo *)CONCAT44(numBits,in_stack_ffffffffffffffc0));
    if (DVar3 == MCDisassembler_Fail) {
      return MCDisassembler_Fail;
    }
  }
  else if ((((uVar2 == 0x58f) || (uVar2 == 0x5bb)) || (uVar2 == 0x66c)) &&
          (DVar3 = DecodeGPRMM16ZeroRegisterClass
                             (in_RCX,RegNo,CONCAT44(uVar1,uVar2),
                              (MCRegisterInfo *)CONCAT44(numBits,in_stack_ffffffffffffffc0)),
          DVar3 == MCDisassembler_Fail)) {
    return MCDisassembler_Fail;
  }
  DVar3 = DecodeGPRMM16RegisterClass
                    (in_RCX,RegNo,CONCAT44(uVar1,uVar2),
                     (MCRegisterInfo *)CONCAT44(numBits,in_stack_ffffffffffffffc0));
  if (DVar3 == MCDisassembler_Fail) {
    return MCDisassembler_Fail;
  }
  uVar2 = MCInst_getOpcode(in_RDI);
  if (uVar2 == 0x39b) {
    if (RegNo == 0xf) {
      MCOperand_CreateImm0(in_RDI,-1);
      return MCDisassembler_Success;
    }
    MCOperand_CreateImm0(in_RDI,(ulong)RegNo);
    return MCDisassembler_Success;
  }
  if (uVar2 == 0x3ba) {
LAB_003259e7:
    MCOperand_CreateImm0(in_RDI,(ulong)(RegNo << 1));
  }
  else {
    if (uVar2 != 0x3d6) {
      if (uVar2 == 0x58f) {
        MCOperand_CreateImm0(in_RDI,(ulong)RegNo);
        return MCDisassembler_Success;
      }
      if (uVar2 == 0x5bb) goto LAB_003259e7;
      if (uVar2 != 0x66c) {
        return MCDisassembler_Success;
      }
    }
    MCOperand_CreateImm0(in_RDI,(ulong)(RegNo << 2));
  }
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMemMMImm4(MCInst *Inst,
		unsigned Insn, uint64_t Address, MCRegisterInfo *Decoder)
{
	unsigned Offset = Insn & 0xf;
	unsigned Reg = fieldFromInstruction(Insn, 7, 3);
	unsigned Base = fieldFromInstruction(Insn, 4, 3);

	switch (MCInst_getOpcode(Inst)) {
		case Mips_LBU16_MM:
		case Mips_LHU16_MM:
		case Mips_LW16_MM:
			if (DecodeGPRMM16RegisterClass(Inst, Reg, Address, Decoder)
					== MCDisassembler_Fail)
				return MCDisassembler_Fail;
			break;
		case Mips_SB16_MM:
		case Mips_SH16_MM:
		case Mips_SW16_MM:
			if (DecodeGPRMM16ZeroRegisterClass(Inst, Reg, Address, Decoder)
					== MCDisassembler_Fail)
				return MCDisassembler_Fail;
			break;
	}

	if (DecodeGPRMM16RegisterClass(Inst, Base, Address, Decoder)
			== MCDisassembler_Fail)
		return MCDisassembler_Fail;

	switch (MCInst_getOpcode(Inst)) {
		case Mips_LBU16_MM:
			if (Offset == 0xf)
				MCOperand_CreateImm0(Inst, -1);
			else
				MCOperand_CreateImm0(Inst, Offset);
			break;
		case Mips_SB16_MM:
			MCOperand_CreateImm0(Inst, Offset);
			break;
		case Mips_LHU16_MM:
		case Mips_SH16_MM:
			MCOperand_CreateImm0(Inst, Offset << 1);
			break;
		case Mips_LW16_MM:
		case Mips_SW16_MM:
			MCOperand_CreateImm0(Inst, Offset << 2);
			break;
	}

	return MCDisassembler_Success;
}